

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServerBase::cmServerBase(cmServerBase *this,cmConnection *connection)

{
  int iVar1;
  
  this->_vptr_cmServerBase = (_func_int **)&PTR__cmServerBase_0066ad40;
  (this->Connections).
  super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Connections).
  super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  auto_handle_base_<uv_async_s>::auto_handle_base_
            ((auto_handle_base_<uv_async_s> *)&this->ShutdownSignal);
  (this->ShutdownSignal).super_auto_handle_<uv_async_s>.super_auto_handle_base_<uv_async_s>.
  _vptr_auto_handle_base_ = (_func_int **)&PTR_allocate_0066a218;
  (this->ShutdownSignal).handleMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->ShutdownSignal).handleMutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->ShutdownSignal).handleMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->ShutdownSignal).handleMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->ShutdownSignal).handleMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->ServeThreadId = 0;
  auto_handle_base_<uv_signal_s>::auto_handle_base_
            ((auto_handle_base_<uv_signal_s> *)&this->SIGINTHandler);
  (this->SIGINTHandler).super_auto_handle_<uv_signal_s>.super_auto_handle_base_<uv_signal_s>.
  _vptr_auto_handle_base_ = (_func_int **)&PTR_allocate_0066a260;
  auto_handle_base_<uv_signal_s>::auto_handle_base_
            ((auto_handle_base_<uv_signal_s> *)&this->SIGHUPHandler);
  (this->SIGHUPHandler).super_auto_handle_<uv_signal_s>.super_auto_handle_base_<uv_signal_s>.
  _vptr_auto_handle_base_ = (_func_int **)&PTR_allocate_0066a260;
  iVar1 = uv_loop_init(&this->Loop);
  (this->Loop).data = this;
  if (iVar1 != 0) {
    __assert_fail("err == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                  ,0x1ff,"cmServerBase::cmServerBase(cmConnection *)");
  }
  iVar1 = uv_rwlock_init(&this->ConnectionsMutex);
  if (iVar1 == 0) {
    (*this->_vptr_cmServerBase[2])(this,connection);
    return;
  }
  __assert_fail("err == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                ,0x202,"cmServerBase::cmServerBase(cmConnection *)");
}

Assistant:

cmServerBase::cmServerBase(cmConnection* connection)
{
  auto err = uv_loop_init(&Loop);
  Loop.data = this;
  assert(err == 0);

  err = uv_rwlock_init(&ConnectionsMutex);
  assert(err == 0);

  AddNewConnection(connection);
}